

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

void __thiscall
gl4cts::anon_unknown_0::SubroutinesTessEval::VerifyTES
          (SubroutinesTessEval *this,GLuint program,long *error)

{
  CallLogWrapper *this_00;
  uint uVar1;
  mapped_type *pmVar2;
  undefined4 in_register_00000034;
  allocator<char> local_f5;
  GLenum propsS [1];
  key_type local_f0;
  GLint expectedS [1];
  GLenum propsU [5];
  GLint expectedU [5];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesTU;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesTS;
  
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])
            (this,CONCAT44(in_register_00000034,program),0x92ea,0x92f5,1,error);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,program,0x92ea,0x92f6,2,error);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,program,0x92f0,0x92f5,1,error);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,program,0x92f0,0x92f6,2,error);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,program,0x92f0,0x92f8,1,error);
  indicesTS._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesTS._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesTS._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesTS._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesTS._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesTS._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesTS._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&indicesTU,"x",(allocator<char> *)&local_f0);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,program,0x92ea,&indicesTS,&indicesTU,error);
  std::__cxx11::string::~string((string *)&indicesTU);
  indicesTU._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesTU._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesTU._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesTU._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesTU._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesTU._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesTU._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"a",(allocator<char> *)propsU);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,program,0x92f0,&indicesTU,&local_f0,error);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"x",(allocator<char> *)expectedU);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesTS,&local_f0);
  uVar1 = *pmVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)propsU,"x",(allocator<char> *)propsS)
  ;
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,program,0x92ea,(ulong)uVar1,propsU,error);
  std::__cxx11::string::~string((string *)propsU);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"a",(allocator<char> *)expectedU);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesTU,&local_f0);
  uVar1 = *pmVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)propsU,"a",(allocator<char> *)propsS)
  ;
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,program,0x92f0,(ulong)uVar1,propsU,error);
  std::__cxx11::string::~string((string *)propsU);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"a",(allocator<char> *)propsU);
  this_00 = &(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  uVar1 = glu::CallLogWrapper::glGetSubroutineUniformLocation(this_00,program,0x8e87,"a");
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x11])(this,program,0x92f0,&local_f0,(ulong)uVar1,error);
  std::__cxx11::string::~string((string *)&local_f0);
  propsS[0] = 0x92f9;
  expectedS[0] = 2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"x",(allocator<char> *)propsU);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesTS,&local_f0);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,program,0x92ea,(ulong)*pmVar2,1,propsS,1,expectedS,error);
  std::__cxx11::string::~string((string *)&local_f0);
  propsU[0] = 0x92f9;
  propsU[1] = 0x92fb;
  propsU[2] = 0x8e4a;
  propsU[3] = 0x930e;
  propsU[4] = 0x8e4b;
  expectedU[0] = 2;
  expectedU[1] = 1;
  expectedU[2] = 1;
  expectedU[3] = glu::CallLogWrapper::glGetSubroutineUniformLocation(this_00,program,0x8e87,"a");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"x",&local_f5);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesTS,&local_f0);
  expectedU[4] = *pmVar2;
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"a",&local_f5);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesTU,&local_f0);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,program,0x92f0,(ulong)*pmVar2,5,propsU,5,(allocator<char> *)expectedU,error);
  std::__cxx11::string::~string((string *)&local_f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesTU._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesTS._M_t);
  return;
}

Assistant:

virtual void inline VerifyTES(GLuint program, long& error)
	{
		VerifyGetProgramInterfaceiv(program, GL_TESS_EVALUATION_SUBROUTINE, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_TESS_EVALUATION_SUBROUTINE, GL_MAX_NAME_LENGTH, 2, error);

		VerifyGetProgramInterfaceiv(program, GL_TESS_EVALUATION_SUBROUTINE_UNIFORM, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_TESS_EVALUATION_SUBROUTINE_UNIFORM, GL_MAX_NAME_LENGTH, 2, error);
		VerifyGetProgramInterfaceiv(program, GL_TESS_EVALUATION_SUBROUTINE_UNIFORM, GL_MAX_NUM_COMPATIBLE_SUBROUTINES,
									1, error);

		std::map<std::string, GLuint> indicesTS;
		VerifyGetProgramResourceIndex(program, GL_TESS_EVALUATION_SUBROUTINE, indicesTS, "x", error);
		std::map<std::string, GLuint> indicesTU;
		VerifyGetProgramResourceIndex(program, GL_TESS_EVALUATION_SUBROUTINE_UNIFORM, indicesTU, "a", error);

		VerifyGetProgramResourceName(program, GL_TESS_EVALUATION_SUBROUTINE, indicesTS["x"], "x", error);
		VerifyGetProgramResourceName(program, GL_TESS_EVALUATION_SUBROUTINE_UNIFORM, indicesTU["a"], "a", error);

		VerifyGetProgramResourceLocation(program, GL_TESS_EVALUATION_SUBROUTINE_UNIFORM, "a",
										 glGetSubroutineUniformLocation(program, GL_TESS_EVALUATION_SHADER, "a"),
										 error);

		GLenum propsS[]	= { GL_NAME_LENGTH };
		GLint  expectedS[] = { 2 };
		VerifyGetProgramResourceiv(program, GL_TESS_EVALUATION_SUBROUTINE, indicesTS["x"], 1, propsS, 1, expectedS,
								   error);

		GLenum propsU[] = { GL_NAME_LENGTH, GL_ARRAY_SIZE, GL_NUM_COMPATIBLE_SUBROUTINES, GL_LOCATION,
							GL_COMPATIBLE_SUBROUTINES };
		GLint expectedU[] = { 2, 1, 1, glGetSubroutineUniformLocation(program, GL_TESS_EVALUATION_SHADER, "a"),
							  static_cast<GLint>(indicesTS["x"]) };
		VerifyGetProgramResourceiv(program, GL_TESS_EVALUATION_SUBROUTINE_UNIFORM, indicesTU["a"], 5, propsU, 5,
								   expectedU, error);
	}